

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O3

wchar_t checksum(archive_read *a,void *h)

{
  byte bVar1;
  undefined4 uVar2;
  undefined1 auVar3 [13];
  undefined1 auVar4 [13];
  undefined1 auVar5 [13];
  undefined8 uVar6;
  ulong uVar7;
  undefined1 auVar8 [13];
  undefined6 uVar9;
  undefined1 auVar10 [12];
  long lVar11;
  int64_t iVar12;
  int iVar13;
  wchar_t wVar14;
  uint uVar15;
  char *p;
  int iVar16;
  int iVar17;
  int iVar18;
  short sVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 uVar23;
  undefined2 uVar24;
  
  p = (char *)((long)&a->entry + 4);
  lVar11 = 0;
  while (((bVar1 = p[lVar11], bVar1 - 0x30 < 8 || (bVar1 == 0x20)) || (bVar1 == 0))) {
    lVar11 = lVar11 + 1;
    if (lVar11 == 8) {
      iVar12 = tar_atol(p,8);
      lVar11 = 0;
      iVar13 = 0;
      do {
        iVar16 = iVar13;
        uVar15 = (uint)*(byte *)((long)&(a->archive).magic + lVar11);
        lVar11 = lVar11 + 1;
        iVar13 = iVar16 + uVar15;
      } while (lVar11 != 0x94);
      iVar13 = iVar16 + uVar15 + 0x100;
      iVar16 = 0;
      iVar17 = 0;
      iVar18 = 0;
      lVar11 = 0x9c;
      do {
        uVar2 = *(undefined4 *)((long)&(a->archive).magic + lVar11);
        uVar7 = (ulong)(ushort)uVar2 & 0xffffffffffff00ff;
        auVar3._8_4_ = 0;
        auVar3._0_8_ = uVar7;
        auVar3[0xc] = (char)((uint)uVar2 >> 0x18);
        auVar4[8] = (char)((uint)uVar2 >> 0x10);
        auVar4._0_8_ = uVar7;
        auVar4[9] = 0;
        auVar4._10_3_ = auVar3._10_3_;
        auVar8._5_8_ = 0;
        auVar8._0_5_ = auVar4._8_5_;
        auVar5[4] = (char)((uint)uVar2 >> 8);
        auVar5._0_4_ = (int)uVar7;
        auVar5[5] = 0;
        auVar5._6_7_ = SUB137(auVar8 << 0x40,6);
        iVar13 = iVar13 + (int)uVar7;
        iVar16 = iVar16 + auVar5._4_4_;
        iVar17 = iVar17 + auVar4._8_4_;
        iVar18 = iVar18 + (uint)(uint3)(auVar3._10_3_ >> 0x10);
        lVar11 = lVar11 + 4;
      } while (lVar11 != 0x200);
      wVar14 = L'\x01';
      if (iVar18 + iVar16 + iVar17 + iVar13 != (int)iVar12) {
        lVar11 = 0;
        iVar13 = 0;
        do {
          iVar17 = iVar13;
          iVar16 = (int)*(char *)((long)&(a->archive).magic + lVar11);
          lVar11 = lVar11 + 1;
          iVar13 = iVar17 + iVar16;
        } while (lVar11 != 0x94);
        iVar13 = iVar17 + iVar16 + 0x100;
        iVar16 = 0;
        iVar17 = 0;
        iVar18 = 0;
        lVar11 = 0x9c;
        do {
          uVar2 = *(undefined4 *)((long)&(a->archive).magic + lVar11);
          uVar23 = (undefined1)((uint)uVar2 >> 0x18);
          uVar24 = CONCAT11(uVar23,uVar23);
          uVar23 = (undefined1)((uint)uVar2 >> 0x10);
          uVar6 = CONCAT35(CONCAT21(uVar24,uVar23),CONCAT14(uVar23,uVar2));
          uVar23 = (undefined1)((uint)uVar2 >> 8);
          uVar9 = CONCAT51(CONCAT41((int)((ulong)uVar6 >> 0x20),uVar23),uVar23);
          sVar19 = CONCAT11((char)uVar2,(char)uVar2);
          uVar7 = CONCAT62(uVar9,sVar19);
          auVar22._8_4_ = 0;
          auVar22._0_8_ = uVar7;
          auVar22._12_2_ = uVar24;
          auVar22._14_2_ = uVar24;
          uVar24 = (undefined2)((ulong)uVar6 >> 0x20);
          auVar21._12_4_ = auVar22._12_4_;
          auVar21._8_2_ = 0;
          auVar21._0_8_ = uVar7;
          auVar21._10_2_ = uVar24;
          auVar20._10_6_ = auVar21._10_6_;
          auVar20._8_2_ = uVar24;
          auVar20._0_8_ = uVar7;
          uVar24 = (undefined2)uVar9;
          auVar10._4_8_ = auVar20._8_8_;
          auVar10._2_2_ = uVar24;
          auVar10._0_2_ = uVar24;
          iVar13 = iVar13 + ((int)sVar19 >> 8);
          iVar16 = iVar16 + (auVar10._0_4_ >> 0x18);
          iVar17 = iVar17 + (auVar20._8_4_ >> 0x18);
          iVar18 = iVar18 + (auVar21._12_4_ >> 0x18);
          lVar11 = lVar11 + 4;
        } while (lVar11 != 0x200);
        wVar14 = (wchar_t)(iVar18 + iVar16 + iVar17 + iVar13 == (int)iVar12);
      }
      return wVar14;
    }
  }
  return L'\0';
}

Assistant:

static int
checksum(struct archive_read *a, const void *h)
{
	const unsigned char *bytes;
	const struct archive_entry_header_ustar	*header;
	int check, sum;
	size_t i;

	(void)a; /* UNUSED */
	bytes = (const unsigned char *)h;
	header = (const struct archive_entry_header_ustar *)h;

	/* Checksum field must hold an octal number */
	for (i = 0; i < sizeof(header->checksum); ++i) {
		char c = header->checksum[i];
		if (c != ' ' && c != '\0' && (c < '0' || c > '7'))
			return 0;
	}

	/*
	 * Test the checksum.  Note that POSIX specifies _unsigned_
	 * bytes for this calculation.
	 */
	sum = (int)tar_atol(header->checksum, sizeof(header->checksum));
	check = 0;
	for (i = 0; i < 148; i++)
		check += (unsigned char)bytes[i];
	for (; i < 156; i++)
		check += 32;
	for (; i < 512; i++)
		check += (unsigned char)bytes[i];
	if (sum == check)
		return (1);

	/*
	 * Repeat test with _signed_ bytes, just in case this archive
	 * was created by an old BSD, Solaris, or HP-UX tar with a
	 * broken checksum calculation.
	 */
	check = 0;
	for (i = 0; i < 148; i++)
		check += (signed char)bytes[i];
	for (; i < 156; i++)
		check += 32;
	for (; i < 512; i++)
		check += (signed char)bytes[i];
	if (sum == check)
		return (1);

#if DONT_FAIL_ON_CRC_ERROR
	/* Speed up fuzzing by pretending the checksum is always right. */
	return (1);
#else
	return (0);
#endif
}